

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O0

int __thiscall Widget_Browser::handle(Widget_Browser *this,int e)

{
  bool bVar1;
  Fl_Type *pFVar2;
  int iVar3;
  int iVar4;
  Fl_Type *local_50;
  Fl_Type *j;
  Fl_Type *k_1;
  Fl_Type *k;
  int H;
  int W;
  int Y;
  int X;
  Fl_Type *l;
  Widget_Browser *pWStack_18;
  int e_local;
  Widget_Browser *this_local;
  
  l._4_4_ = e;
  pWStack_18 = this;
  Fl_Browser_::bbox(&this->super_Fl_Browser_,&W,&H,(int *)((long)&k + 4),(int *)&k);
  pFVar2 = pushedtitle;
  if (l._4_4_ == 1) {
    iVar4 = Fl::event_inside(W,H,k._4_4_,(int)k);
    if (iVar4 != 0) {
      iVar4 = Fl::event_y();
      _Y = (Fl_Type *)Fl_Browser_::find_item(&this->super_Fl_Browser_,iVar4);
      if (_Y != (Fl_Type *)0x0) {
        iVar4 = _Y->level;
        iVar3 = Fl_Browser_::hposition(&this->super_Fl_Browser_);
        W = ((iVar4 * 0xc + 3) - iVar3) + W;
        iVar4 = (*_Y->_vptr_Fl_Type[0x16])();
        if (((iVar4 != 0) && (iVar4 = Fl::event_x(), W < iVar4)) &&
           (iVar4 = Fl::event_x(), iVar4 < W + 0xd)) {
          pushedtitle = _Y;
          handle::title = _Y;
          Fl_Browser_::redraw_line(&this->super_Fl_Browser_,_Y);
          return 1;
        }
      }
    }
  }
  else if (l._4_4_ == 2) {
    if (handle::title != (Fl_Type *)0x0) {
      _Y = pushedtitle;
      pushedtitle = (Fl_Type *)0x0;
      handle::title = (Fl_Type *)0x0;
      if (pFVar2 != (Fl_Type *)0x0) {
        if (pFVar2->open_ == '\0') {
          pFVar2->open_ = '\x01';
          j = pFVar2->next;
          while( true ) {
            bVar1 = false;
            if (j != (Fl_Type *)0x0) {
              bVar1 = _Y->level < j->level;
            }
            if (!bVar1) break;
            j->visible = '\x01';
            iVar4 = (*j->_vptr_Fl_Type[0x16])();
            if ((iVar4 == 0) || (j->open_ != '\0')) {
              j = j->next;
            }
            else {
              local_50 = j->next;
              while( true ) {
                bVar1 = false;
                if (local_50 != (Fl_Type *)0x0) {
                  bVar1 = j->level < local_50->level;
                }
                if (!bVar1) break;
                local_50 = local_50->next;
              }
              j = local_50;
            }
          }
        }
        else {
          pFVar2->open_ = '\0';
          k_1 = pFVar2->next;
          while( true ) {
            bVar1 = false;
            if (k_1 != (Fl_Type *)0x0) {
              bVar1 = pFVar2->level < k_1->level;
            }
            if (!bVar1) break;
            k_1->visible = '\0';
            k_1 = k_1->next;
          }
        }
        Fl_Widget::redraw((Fl_Widget *)this);
      }
      return 1;
    }
    iVar4 = Fl::event_y();
    _Y = (Fl_Type *)Fl_Browser_::find_item(&this->super_Fl_Browser_,iVar4);
    if (((_Y != (Fl_Type *)0x0) && (_Y->new_selected != '\0')) &&
       ((iVar4 = Fl::event_clicks(), iVar4 != 0 || (iVar4 = Fl::event_state(0x40000), iVar4 != 0))))
    {
      (*_Y->_vptr_Fl_Type[0xb])();
    }
  }
  else if ((l._4_4_ == 5) && (handle::title != (Fl_Type *)0x0)) {
    iVar4 = Fl::event_y();
    _Y = (Fl_Type *)Fl_Browser_::find_item(&this->super_Fl_Browser_,iVar4);
    if (_Y != (Fl_Type *)0x0) {
      iVar4 = _Y->level;
      iVar3 = Fl_Browser_::hposition(&this->super_Fl_Browser_);
      W = ((iVar4 * 0xc + 3) - iVar3) + W;
      iVar4 = (*_Y->_vptr_Fl_Type[0x16])();
      if (((iVar4 == 0) || (iVar4 = Fl::event_x(), iVar4 <= W)) ||
         (iVar4 = Fl::event_x(), W + 0xd <= iVar4)) {
        _Y = (Fl_Type *)0x0;
      }
    }
    if (_Y != pushedtitle) {
      if (pushedtitle != (Fl_Type *)0x0) {
        Fl_Browser_::redraw_line(&this->super_Fl_Browser_,pushedtitle);
      }
      if (_Y != (Fl_Type *)0x0) {
        Fl_Browser_::redraw_line(&this->super_Fl_Browser_,_Y);
      }
      pushedtitle = _Y;
    }
    return 1;
  }
  iVar4 = Fl_Browser_::handle(&this->super_Fl_Browser_,l._4_4_);
  return iVar4;
}

Assistant:

int Widget_Browser::handle(int e) {
  static Fl_Type *title;
  Fl_Type *l;
  int X,Y,W,H; bbox(X,Y,W,H);
  switch (e) {
  case FL_PUSH:
    if (!Fl::event_inside(X,Y,W,H)) break;
    l = (Fl_Type*)find_item(Fl::event_y());
    if (l) {
      X += 3 + 12*l->level - hposition();
      if (l->is_parent() && Fl::event_x()>X && Fl::event_x()<X+13) {
	title = pushedtitle = l;
	redraw_line(l);
	return 1;
      }
    }
    break;
  case FL_DRAG:
    if (!title) break;
    l = (Fl_Type*)find_item(Fl::event_y());
    if (l) {
      X += 3 + 12*l->level - hposition();
      if (l->is_parent() && Fl::event_x()>X && Fl::event_x()<X+13) ;
      else l = 0;
    }
    if (l != pushedtitle) {
      if (pushedtitle) redraw_line(pushedtitle);
      if (l) redraw_line(l);
      pushedtitle = l;
    }
    return 1;
  case FL_RELEASE:
    if (!title) {
      l = (Fl_Type*)find_item(Fl::event_y());
      if (l && l->new_selected && (Fl::event_clicks() || Fl::event_state(FL_CTRL)))
	l->open();
      break;
    }
    l = pushedtitle;
    title = pushedtitle = 0;
    if (l) {
      if (l->open_) {
	l->open_ = 0;
	for (Fl_Type*k = l->next; k&&k->level>l->level; k = k->next)
	  k->visible = 0;
      } else {
	l->open_ = 1;
	for (Fl_Type*k=l->next; k&&k->level>l->level;) {
	  k->visible = 1;
	  if (k->is_parent() && !k->open_) {
	    Fl_Type *j;
	    for (j = k->next; j && j->level>k->level; j = j->next) {/*empty*/}
	    k = j;
	  } else
	    k = k->next;
	}
      }
      redraw();
    }
    return 1;
  }
  return Fl_Browser_::handle(e);
}